

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-app.h
# Opt level: O1

void __thiscall
mp::SolverApp<TestSolver,_TestNLReader>::Solve(SolverApp<TestSolver,_TestNLReader> *this)

{
  TestSolver *this_00;
  SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>
  *pSVar1;
  pointer pcVar2;
  StrictMockProblemBuilder *pSVar3;
  Result RVar4;
  Result pSVar5;
  long *plVar6;
  uint uVar7;
  long lVar8;
  AppSolutionHandler<TestSolver> sol_handler;
  SolutionHandler local_f0;
  long *local_e8 [2];
  long local_d8 [2];
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  TestSolver *local_a8;
  StrictMockProblemBuilder *local_a0;
  void *local_98;
  undefined8 uStack_90;
  long local_88;
  long *local_80;
  long local_78;
  undefined4 local_70;
  uint local_6c;
  AMPLS_ModelTraits local_68;
  
  pSVar1 = (this->handler_)._M_t.
           super___uniq_ptr_impl<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_*,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
           .
           super__Head_base<0UL,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_*,_false>
           ._M_head_impl;
  lVar8 = (long)pSVar1->num_options_;
  plVar6 = pSVar1->options_;
  pcVar2 = (this->filename_no_ext)._M_dataplus._M_p;
  this_00 = &this->solver_;
  pSVar3 = (this->builder_)._M_t.
           super___uniq_ptr_impl<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>
           ._M_t.
           super__Tuple_impl<0UL,_StrictMockProblemBuilder_*,_std::default_delete<StrictMockProblemBuilder>_>
           .super__Head_base<0UL,_StrictMockProblemBuilder_*,_false>._M_head_impl;
  uVar7 = 0;
  if ((this->output_handler_).has_output == false) {
    uVar7 = this->banner_size;
  }
  local_f0._vptr_SolutionHandler = (_func_int **)&PTR__SolutionWriterImpl_002932c0;
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e8,pcVar2,pcVar2 + (this->filename_no_ext)._M_string_length);
  local_c0 = 0;
  local_b8 = 0;
  local_98 = (void *)0x0;
  uStack_90 = 0;
  local_88 = 0;
  local_70 = 0;
  local_f0._vptr_SolutionHandler = (_func_int **)&PTR__SolutionWriterImpl_00293220;
  local_c8 = &local_b8;
  local_a8 = this_00;
  local_a0 = pSVar3;
  local_80 = plVar6;
  local_78 = lVar8;
  local_6c = uVar7;
  if ((this->callbacks_).check != (Checker_AMPLS_ModeltTraits)0x0) {
    pSVar5 = StrictMockProblemBuilder::problem
                       ((this->builder_)._M_t.
                        super___uniq_ptr_impl<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_StrictMockProblemBuilder_*,_std::default_delete<StrictMockProblemBuilder>_>
                        .super__Head_base<0UL,_StrictMockProblemBuilder_*,_false>._M_head_impl);
    RVar4 = MockProblemBuilder::num_vars
                      (&(pSVar5->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder);
    local_68.n_vars = (longlong)RVar4;
    pSVar5 = StrictMockProblemBuilder::problem
                       ((this->builder_)._M_t.
                        super___uniq_ptr_impl<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_StrictMockProblemBuilder_*,_std::default_delete<StrictMockProblemBuilder>_>
                        .super__Head_base<0UL,_StrictMockProblemBuilder_*,_false>._M_head_impl);
    RVar4 = MockProblemBuilder::num_algebraic_cons
                      (&(pSVar5->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder);
    local_68.n_alg_con = (longlong)RVar4;
    pSVar5 = StrictMockProblemBuilder::problem
                       ((this->builder_)._M_t.
                        super___uniq_ptr_impl<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_StrictMockProblemBuilder_*,_std::default_delete<StrictMockProblemBuilder>_>
                        .super__Head_base<0UL,_StrictMockProblemBuilder_*,_false>._M_head_impl);
    RVar4 = MockProblemBuilder::num_logical_cons
                      (&(pSVar5->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder);
    local_68.n_log_con = (longlong)RVar4;
    local_68.n_quad_con = 0;
    local_68.n_conic_con = 0;
    (*(this->callbacks_).check)(&local_68);
  }
  pSVar5 = StrictMockProblemBuilder::problem
                     ((this->builder_)._M_t.
                      super___uniq_ptr_impl<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_StrictMockProblemBuilder_*,_std::default_delete<StrictMockProblemBuilder>_>
                      .super__Head_base<0UL,_StrictMockProblemBuilder_*,_false>._M_head_impl);
  if ((this->solver_).mock_solve_ == true) {
    TestSolver::DoSolve(this_00,pSVar5,&local_f0);
  }
  local_f0._vptr_SolutionHandler = (_func_int **)&PTR__SolutionWriterImpl_002932c0;
  if (local_98 != (void *)0x0) {
    operator_delete(local_98,local_88 - (long)local_98);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  return;
}

Assistant:

void SolverApp<Solver, Reader>::Solve() {
  ArrayRef<long> options(handler_->options(), handler_->num_options());
  internal::AppSolutionHandler<Solver> sol_handler(
    filename_no_ext, solver_, *builder_, options,
    output_handler_.has_output ? 0 : banner_size);

  if (GetCallbacks().check)
  {
    AMPLS_ModelTraits mt;
    mt.n_vars = builder_->problem().num_vars();
    mt.n_alg_con = builder_->problem().num_algebraic_cons();
    mt.n_log_con = builder_->problem().num_logical_cons();
    mt.n_conic_con = 0;
    mt.n_quad_con = 0;
    GetCallbacks().check(&mt);
  }
  solver_.Solve(builder_->problem(), sol_handler);
}